

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_expression.cpp
# Opt level: O3

hash_t __thiscall duckdb::ParameterExpression::Hash(ParameterExpression *this)

{
  hash_t hVar1;
  hash_t hVar2;
  
  hVar1 = ParsedExpression::Hash(&this->super_ParsedExpression);
  hVar2 = duckdb::Hash((this->identifier)._M_dataplus._M_p,(this->identifier)._M_string_length);
  return hVar2 ^ hVar1;
}

Assistant:

hash_t ParameterExpression::Hash() const {
	hash_t result = ParsedExpression::Hash();
	return CombineHash(duckdb::Hash(identifier.c_str(), identifier.size()), result);
}